

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O3

int run_test_fs_chmod(void)

{
  int iVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  __uid_t _Var2;
  int extraout_EAX_01;
  uv_loop_t *puVar3;
  undefined8 uVar4;
  uv_loop_t *puVar5;
  void *pvVar6;
  char *pcVar7;
  undefined8 *puVar8;
  int **ppiVar9;
  uv_loop_t *puVar10;
  char *pcVar11;
  undefined8 *puVar12;
  char *pcVar13;
  int **unaff_R14;
  int **ppiVar14;
  int **ppiVar15;
  int **ppiVar16;
  int **ppiVar17;
  uv_buf_t uVar18;
  uv_fs_t req;
  undefined1 auStack_b10 [88];
  long lStack_ab8;
  long lStack_ab0;
  code *pcStack_958;
  code *pcStack_950;
  undefined8 uStack_948;
  char acStack_938 [88];
  char *pcStack_8e0;
  uv_loop_t *puStack_780;
  int **ppiStack_778;
  code *pcStack_770;
  code *pcStack_768;
  uv_loop_t *puStack_760;
  code *pcStack_758;
  int *apiStack_750 [11];
  uv_loop_t *puStack_6f8;
  int **ppiStack_598;
  int **ppiStack_590;
  undefined8 uStack_588;
  int *apiStack_578 [11];
  int **ppiStack_520;
  undefined8 *puStack_3c0;
  int **ppiStack_3b8;
  code *pcStack_3b0;
  code *pcStack_3a8;
  undefined1 auStack_398 [88];
  long lStack_340;
  uint uStack_320;
  code *pcStack_1e0;
  undefined8 local_1d8;
  int *local_1d0 [11];
  char *local_178;
  
  pcVar7 = "test_file";
  pcStack_1e0 = (code *)0x154ee1;
  unlink("test_file");
  pcStack_1e0 = (code *)0x154ee6;
  loop = (uv_loop_t *)uv_default_loop();
  ppiVar9 = local_1d0;
  puVar3 = (uv_loop_t *)0x0;
  pcStack_1e0 = (code *)0x154f0a;
  iVar1 = uv_fs_open(0,ppiVar9,"test_file",0x42,0x180,0);
  pcVar11 = local_178;
  if (iVar1 < 0) {
    pcStack_1e0 = (code *)0x1551dd;
    run_test_fs_chmod_cold_1();
LAB_001551dd:
    pcStack_1e0 = (code *)0x1551e2;
    run_test_fs_chmod_cold_2();
LAB_001551e2:
    pcStack_1e0 = (code *)0x1551e7;
    run_test_fs_chmod_cold_3();
LAB_001551e7:
    pcStack_1e0 = (code *)0x1551ec;
    run_test_fs_chmod_cold_4();
LAB_001551ec:
    pcStack_1e0 = (code *)0x1551f1;
    run_test_fs_chmod_cold_5();
LAB_001551f1:
    pcStack_1e0 = (code *)0x1551f6;
    run_test_fs_chmod_cold_6();
LAB_001551f6:
    pcStack_1e0 = (code *)0x1551fb;
    run_test_fs_chmod_cold_7();
LAB_001551fb:
    pcStack_1e0 = (code *)0x155200;
    run_test_fs_chmod_cold_8();
LAB_00155200:
    pcStack_1e0 = (code *)0x155205;
    run_test_fs_chmod_cold_9();
LAB_00155205:
    pcStack_1e0 = (code *)0x15520a;
    run_test_fs_chmod_cold_10();
LAB_0015520a:
    pcStack_1e0 = (code *)0x15520f;
    run_test_fs_chmod_cold_11();
LAB_0015520f:
    pcStack_1e0 = (code *)0x155214;
    run_test_fs_chmod_cold_12();
LAB_00155214:
    pcStack_1e0 = (code *)0x155219;
    run_test_fs_chmod_cold_13();
LAB_00155219:
    pcStack_1e0 = (code *)0x15521e;
    run_test_fs_chmod_cold_14();
LAB_0015521e:
    pcStack_1e0 = (code *)0x155223;
    run_test_fs_chmod_cold_15();
LAB_00155223:
    pcStack_1e0 = (code *)0x155228;
    run_test_fs_chmod_cold_16();
  }
  else {
    pcVar7 = local_178;
    if ((long)local_178 < 0) goto LAB_001551dd;
    unaff_R14 = local_1d0;
    pcStack_1e0 = (code *)0x154f2d;
    uv_fs_req_cleanup(unaff_R14);
    pcStack_1e0 = (code *)0x154f3e;
    iov = (uv_buf_t)uv_buf_init(test_buf,0xd);
    local_1d8 = 0;
    puVar3 = (uv_loop_t *)0x0;
    pcStack_1e0 = (code *)0x154f74;
    ppiVar9 = unaff_R14;
    iVar1 = uv_fs_write(0,unaff_R14,(ulong)pcVar11 & 0xffffffff,&iov,1,0xffffffffffffffff);
    pcVar7 = pcVar11;
    if (iVar1 != 0xd) goto LAB_001551e2;
    if (local_178 != (char *)0xd) goto LAB_001551e7;
    unaff_R14 = local_1d0;
    pcStack_1e0 = (code *)0x154f96;
    uv_fs_req_cleanup();
    puVar3 = (uv_loop_t *)0x0;
    pcStack_1e0 = (code *)0x154faf;
    ppiVar9 = unaff_R14;
    iVar1 = uv_fs_chmod(0,unaff_R14,"test_file",0x80,0);
    if (iVar1 != 0) goto LAB_001551ec;
    if (local_178 != (char *)0x0) goto LAB_001551f1;
    unaff_R14 = local_1d0;
    pcStack_1e0 = (code *)0x154fd0;
    uv_fs_req_cleanup(unaff_R14);
    pcStack_1e0 = (code *)0x154fe4;
    check_permission("test_file",0x80);
    puVar3 = (uv_loop_t *)0x0;
    pcStack_1e0 = (code *)0x154ff9;
    ppiVar9 = unaff_R14;
    iVar1 = uv_fs_chmod(0,unaff_R14,"test_file",0x100,0);
    if (iVar1 != 0) goto LAB_001551f6;
    if (local_178 != (char *)0x0) goto LAB_001551fb;
    unaff_R14 = local_1d0;
    pcStack_1e0 = (code *)0x15501a;
    uv_fs_req_cleanup(unaff_R14);
    pcStack_1e0 = (code *)0x15502b;
    check_permission("test_file",0x100);
    puVar3 = (uv_loop_t *)0x0;
    pcStack_1e0 = (code *)0x15503f;
    ppiVar9 = unaff_R14;
    iVar1 = uv_fs_fchmod(0,unaff_R14,(ulong)pcVar11 & 0xffffffff,0x180,0);
    if (iVar1 != 0) goto LAB_00155200;
    if (local_178 != (char *)0x0) goto LAB_00155205;
    unaff_R14 = local_1d0;
    pcStack_1e0 = (code *)0x155060;
    uv_fs_req_cleanup(unaff_R14);
    pcStack_1e0 = (code *)0x155074;
    check_permission("test_file",0x180);
    local_1d0[0] = &run_test_fs_chmod::mode;
    pcStack_1e0 = (code *)0x15509c;
    ppiVar9 = unaff_R14;
    puVar3 = loop;
    iVar1 = uv_fs_chmod(loop,unaff_R14,"test_file",0x80,chmod_cb);
    if (iVar1 != 0) goto LAB_0015520a;
    ppiVar9 = (int **)0x0;
    pcStack_1e0 = (code *)0x1550b2;
    puVar3 = loop;
    uv_run();
    if (chmod_cb_count != 1) goto LAB_0015520f;
    chmod_cb_count = 0;
    ppiVar9 = local_1d0;
    local_1d0[0] = &run_test_fs_chmod::mode_1;
    pcStack_1e0 = (code *)0x1550f7;
    puVar3 = loop;
    iVar1 = uv_fs_chmod(loop,ppiVar9,"test_file",0x100,chmod_cb);
    if (iVar1 != 0) goto LAB_00155214;
    ppiVar9 = (int **)0x0;
    pcStack_1e0 = (code *)0x15510d;
    puVar3 = loop;
    uv_run();
    if (chmod_cb_count != 1) goto LAB_00155219;
    ppiVar9 = local_1d0;
    local_1d0[0] = &run_test_fs_chmod::mode_2;
    pcStack_1e0 = (code *)0x155143;
    puVar3 = loop;
    iVar1 = uv_fs_fchmod(loop,ppiVar9,(ulong)pcVar11 & 0xffffffff,0x180,fchmod_cb);
    if (iVar1 != 0) goto LAB_0015521e;
    ppiVar9 = (int **)0x0;
    pcStack_1e0 = (code *)0x155159;
    puVar3 = loop;
    uv_run();
    if (fchmod_cb_count != 1) goto LAB_00155223;
    pcStack_1e0 = (code *)0x15517b;
    uv_fs_close(loop,local_1d0,(ulong)pcVar11 & 0xffffffff,0);
    pcStack_1e0 = (code *)0x155189;
    uv_run(loop,0);
    pcStack_1e0 = (code *)0x155195;
    unlink("test_file");
    pcStack_1e0 = (code *)0x15519a;
    pcVar7 = (char *)uv_default_loop();
    pcStack_1e0 = (code *)0x1551ae;
    uv_walk(pcVar7,close_walk_cb,0);
    ppiVar9 = (int **)0x0;
    pcStack_1e0 = (code *)0x1551b8;
    uv_run(pcVar7);
    pcStack_1e0 = (code *)0x1551bd;
    puVar3 = (uv_loop_t *)uv_default_loop();
    pcStack_1e0 = (code *)0x1551c5;
    iVar1 = uv_loop_close();
    if (iVar1 == 0) {
      return 0;
    }
  }
  pcStack_1e0 = check_permission;
  run_test_fs_chmod_cold_17();
  puVar8 = (undefined8 *)((ulong)ppiVar9 & 0xffffffff);
  puVar12 = (undefined8 *)0x0;
  pcStack_3a8 = (code *)0x155248;
  pcStack_1e0 = (code *)pcVar7;
  iVar1 = uv_fs_stat(0,auStack_398,puVar3,0);
  if (iVar1 == 0) {
    if (lStack_340 != 0) goto LAB_0015527c;
    if ((uStack_320 & 0x1ff) == (uint)ppiVar9) {
      pcStack_3a8 = (code *)0x15526e;
      iVar1 = uv_fs_req_cleanup(auStack_398);
      return iVar1;
    }
  }
  else {
    pcStack_3a8 = (code *)0x15527c;
    check_permission_cold_1();
LAB_0015527c:
    pcStack_3a8 = (code *)0x155281;
    check_permission_cold_2();
  }
  pcStack_3a8 = chmod_cb;
  check_permission_cold_3();
  pcStack_3a8 = (code *)puVar8;
  if (*(int *)(puVar12 + 8) == 0xd) {
    puVar8 = puVar12;
    if (puVar12[0xb] == 0) {
      chmod_cb_count = chmod_cb_count + 1;
      pcStack_3b0 = (code *)0x1552a5;
      uv_fs_req_cleanup(puVar12);
      check_permission("test_file",*(uint *)*puVar12);
      return extraout_EAX;
    }
  }
  else {
    pcStack_3b0 = (code *)0x1552bc;
    chmod_cb_cold_1();
  }
  pcStack_3b0 = fchmod_cb;
  chmod_cb_cold_2();
  pcStack_3b0 = (code *)puVar8;
  if (*(int *)(puVar12 + 8) == 0xe) {
    puStack_3c0 = puVar12;
    if (puVar12[0xb] == 0) {
      fchmod_cb_count = fchmod_cb_count + 1;
      ppiStack_3b8 = (int **)0x1552e0;
      uv_fs_req_cleanup(puVar12);
      check_permission("test_file",*(uint *)*puVar12);
      return extraout_EAX_00;
    }
  }
  else {
    ppiStack_3b8 = (int **)0x1552f7;
    fchmod_cb_cold_1();
    puStack_3c0 = puVar8;
  }
  ppiStack_3b8 = (int **)run_test_fs_unlink_readonly;
  fchmod_cb_cold_2();
  ppiVar9 = (int **)0x184395;
  ppiStack_590 = (int **)0x155315;
  ppiStack_3b8 = unaff_R14;
  unlink("test_file");
  ppiStack_590 = (int **)0x15531a;
  loop = (uv_loop_t *)uv_default_loop();
  ppiStack_590 = (int **)0x15533e;
  iVar1 = uv_fs_open(0,apiStack_578,"test_file",0x42,0x180,0);
  ppiVar17 = ppiStack_520;
  if (iVar1 < 0) {
    ppiStack_590 = (int **)0x1554db;
    run_test_fs_unlink_readonly_cold_1();
LAB_001554db:
    ppiStack_590 = (int **)0x1554e0;
    run_test_fs_unlink_readonly_cold_2();
LAB_001554e0:
    ppiStack_590 = (int **)0x1554e5;
    run_test_fs_unlink_readonly_cold_3();
LAB_001554e5:
    ppiStack_590 = (int **)0x1554ea;
    run_test_fs_unlink_readonly_cold_4();
LAB_001554ea:
    ppiStack_590 = (int **)0x1554ef;
    run_test_fs_unlink_readonly_cold_5();
LAB_001554ef:
    ppiStack_590 = (int **)0x1554f4;
    run_test_fs_unlink_readonly_cold_6();
LAB_001554f4:
    ppiStack_590 = (int **)0x1554f9;
    run_test_fs_unlink_readonly_cold_7();
LAB_001554f9:
    ppiStack_590 = (int **)0x1554fe;
    run_test_fs_unlink_readonly_cold_8();
  }
  else {
    ppiVar9 = ppiStack_520;
    if ((long)ppiStack_520 < 0) goto LAB_001554db;
    unaff_R14 = apiStack_578;
    ppiStack_590 = (int **)0x155361;
    uv_fs_req_cleanup(unaff_R14);
    ppiStack_590 = (int **)0x155372;
    uVar18 = (uv_buf_t)uv_buf_init(test_buf,0xd);
    uStack_588 = 0;
    ppiStack_590 = (int **)0x1553a8;
    iov = uVar18;
    iVar1 = uv_fs_write(0,unaff_R14,(ulong)ppiVar17 & 0xffffffff,&iov,1,0xffffffffffffffff);
    ppiVar9 = ppiVar17;
    if (iVar1 != 0xd) goto LAB_001554e0;
    if (ppiStack_520 != (int **)0xd) goto LAB_001554e5;
    unaff_R14 = apiStack_578;
    ppiStack_590 = (int **)0x1553ca;
    uv_fs_req_cleanup(unaff_R14);
    ppiStack_590 = (int **)0x1553dd;
    uv_fs_close(loop,unaff_R14,(ulong)ppiVar17 & 0xffffffff,0);
    ppiStack_590 = (int **)0x1553f6;
    iVar1 = uv_fs_chmod(0,unaff_R14,"test_file",0x100,0);
    if (iVar1 != 0) goto LAB_001554ea;
    if (ppiStack_520 != (int **)0x0) goto LAB_001554ef;
    ppiVar9 = apiStack_578;
    ppiStack_590 = (int **)0x155417;
    uv_fs_req_cleanup(ppiVar9);
    unaff_R14 = (int **)0x184395;
    ppiStack_590 = (int **)0x15542b;
    check_permission("test_file",0x100);
    ppiStack_590 = (int **)0x15543a;
    iVar1 = uv_fs_unlink(0,ppiVar9,"test_file",0);
    if (iVar1 != 0) goto LAB_001554f4;
    if (ppiStack_520 != (int **)0x0) goto LAB_001554f9;
    ppiStack_590 = (int **)0x15545b;
    uv_fs_req_cleanup(apiStack_578);
    ppiStack_590 = (int **)0x155469;
    uv_run(loop,0);
    unaff_R14 = (int **)0x184395;
    ppiStack_590 = (int **)0x155485;
    uv_fs_chmod(0,apiStack_578,"test_file",0x180,0);
    ppiStack_590 = (int **)0x15548d;
    uv_fs_req_cleanup(apiStack_578);
    ppiStack_590 = (int **)0x155495;
    unlink("test_file");
    ppiStack_590 = (int **)0x15549a;
    ppiVar9 = (int **)uv_default_loop();
    ppiStack_590 = (int **)0x1554ae;
    uv_walk(ppiVar9,close_walk_cb,0);
    ppiStack_590 = (int **)0x1554b8;
    uv_run(ppiVar9,0);
    ppiStack_590 = (int **)0x1554bd;
    uVar4 = uv_default_loop();
    ppiStack_590 = (int **)0x1554c5;
    iVar1 = uv_loop_close(uVar4);
    if (iVar1 == 0) {
      return 0;
    }
  }
  ppiStack_590 = (int **)run_test_fs_chown;
  run_test_fs_unlink_readonly_cold_9();
  ppiVar14 = apiStack_750;
  ppiVar15 = apiStack_750;
  ppiVar16 = apiStack_750;
  ppiVar17 = apiStack_750;
  puVar10 = (uv_loop_t *)0x184395;
  pcStack_758 = (code *)0x15551c;
  ppiStack_598 = ppiVar9;
  ppiStack_590 = unaff_R14;
  unlink("test_file");
  pcStack_758 = (code *)0x155528;
  unlink("test_file_link");
  pcStack_758 = (code *)0x15552d;
  loop = (uv_loop_t *)uv_default_loop();
  puVar5 = (uv_loop_t *)0x0;
  pcStack_758 = (code *)0x15554f;
  iVar1 = uv_fs_open(0,apiStack_750,"test_file",0x42,0x180,0);
  puVar3 = puStack_6f8;
  if (iVar1 < 0) {
    pcStack_758 = (code *)0x155820;
    run_test_fs_chown_cold_1();
LAB_00155820:
    pcStack_758 = (code *)0x155825;
    run_test_fs_chown_cold_2();
LAB_00155825:
    pcStack_758 = (code *)0x15582a;
    run_test_fs_chown_cold_3();
LAB_0015582a:
    ppiVar14 = unaff_R14;
    pcStack_758 = (code *)0x15582f;
    run_test_fs_chown_cold_4();
LAB_0015582f:
    pcStack_758 = (code *)0x155834;
    run_test_fs_chown_cold_5();
LAB_00155834:
    ppiVar15 = ppiVar14;
    pcStack_758 = (code *)0x155839;
    run_test_fs_chown_cold_6();
LAB_00155839:
    pcStack_758 = (code *)0x15583e;
    run_test_fs_chown_cold_7();
LAB_0015583e:
    pcStack_758 = (code *)0x155843;
    run_test_fs_chown_cold_8();
LAB_00155843:
    pcStack_758 = (code *)0x155848;
    run_test_fs_chown_cold_9();
LAB_00155848:
    pcStack_758 = (code *)0x15584d;
    run_test_fs_chown_cold_10();
LAB_0015584d:
    pcStack_758 = (code *)0x155852;
    run_test_fs_chown_cold_11();
LAB_00155852:
    pcStack_758 = (code *)0x155857;
    run_test_fs_chown_cold_12();
LAB_00155857:
    pcStack_758 = (code *)0x15585c;
    run_test_fs_chown_cold_13();
LAB_0015585c:
    ppiVar16 = ppiVar15;
    pcStack_758 = (code *)0x155861;
    run_test_fs_chown_cold_14();
LAB_00155861:
    pcStack_758 = (code *)0x155866;
    run_test_fs_chown_cold_15();
LAB_00155866:
    ppiVar17 = ppiVar16;
    pcStack_758 = (code *)0x15586b;
    run_test_fs_chown_cold_16();
LAB_0015586b:
    pcStack_758 = (code *)0x155870;
    run_test_fs_chown_cold_17();
LAB_00155870:
    pcStack_758 = (code *)0x155875;
    run_test_fs_chown_cold_18();
LAB_00155875:
    pcStack_758 = (code *)0x15587a;
    run_test_fs_chown_cold_19();
LAB_0015587a:
    pcStack_758 = (code *)0x15587f;
    run_test_fs_chown_cold_20();
  }
  else {
    puVar10 = puStack_6f8;
    if ((long)puStack_6f8 < 0) goto LAB_00155820;
    pcStack_758 = (code *)0x155570;
    uv_fs_req_cleanup();
    puVar5 = (uv_loop_t *)0x0;
    pcStack_758 = (code *)0x15558f;
    iVar1 = uv_fs_chown(0,apiStack_750,"test_file",0xffffffff,0xffffffff,0);
    puVar10 = puVar3;
    unaff_R14 = apiStack_750;
    if (iVar1 != 0) goto LAB_00155825;
    unaff_R14 = apiStack_750;
    if (puStack_6f8 != (uv_loop_t *)0x0) goto LAB_0015582a;
    pcStack_758 = (code *)0x1555ae;
    uv_fs_req_cleanup();
    puVar5 = (uv_loop_t *)0x0;
    pcStack_758 = (code *)0x1555c8;
    iVar1 = uv_fs_fchown(0,apiStack_750,(ulong)puVar3 & 0xffffffff,0xffffffff,0xffffffff,0);
    if (iVar1 != 0) goto LAB_0015582f;
    ppiVar14 = apiStack_750;
    if (puStack_6f8 != (uv_loop_t *)0x0) goto LAB_00155834;
    pcStack_758 = (code *)0x1555e7;
    uv_fs_req_cleanup(apiStack_750);
    pcStack_758 = (code *)0x15560f;
    puVar5 = loop;
    iVar1 = uv_fs_chown(loop,apiStack_750,"test_file",0xffffffff,0xffffffff,chown_cb);
    if (iVar1 != 0) goto LAB_00155839;
    pcStack_758 = (code *)0x155625;
    puVar5 = loop;
    uv_run(loop,0);
    ppiVar15 = apiStack_750;
    if (chown_cb_count != 1) goto LAB_0015583e;
    chown_cb_count = 0;
    pcStack_758 = (code *)0x15565e;
    puVar5 = loop;
    iVar1 = uv_fs_chown(loop,apiStack_750,"test_file",0,0,chown_root_cb);
    ppiVar15 = apiStack_750;
    if (iVar1 != 0) goto LAB_00155843;
    pcStack_758 = (code *)0x155674;
    puVar5 = loop;
    uv_run(loop,0);
    ppiVar15 = apiStack_750;
    if (chown_cb_count != 1) goto LAB_00155848;
    pcStack_758 = (code *)0x1556a4;
    puVar5 = loop;
    iVar1 = uv_fs_fchown(loop,apiStack_750,(ulong)puVar3 & 0xffffffff,0xffffffff,0xffffffff,
                         fchown_cb);
    ppiVar15 = apiStack_750;
    if (iVar1 != 0) goto LAB_0015584d;
    pcStack_758 = (code *)0x1556ba;
    puVar5 = loop;
    uv_run(loop,0);
    ppiVar15 = apiStack_750;
    if (fchown_cb_count != 1) goto LAB_00155852;
    puVar5 = (uv_loop_t *)0x0;
    pcStack_758 = (code *)0x1556e2;
    iVar1 = uv_fs_link(0,apiStack_750,"test_file","test_file_link",0);
    ppiVar15 = apiStack_750;
    if (iVar1 != 0) goto LAB_00155857;
    ppiVar15 = apiStack_750;
    if (puStack_6f8 != (uv_loop_t *)0x0) goto LAB_0015585c;
    pcStack_758 = (code *)0x155701;
    uv_fs_req_cleanup();
    puVar5 = (uv_loop_t *)0x0;
    pcStack_758 = (code *)0x155720;
    iVar1 = uv_fs_lchown(0,apiStack_750,"test_file_link",0xffffffff,0xffffffff,0);
    if (iVar1 != 0) goto LAB_00155861;
    ppiVar16 = apiStack_750;
    if (puStack_6f8 != (uv_loop_t *)0x0) goto LAB_00155866;
    pcStack_758 = (code *)0x15573f;
    uv_fs_req_cleanup(apiStack_750);
    pcStack_758 = (code *)0x155767;
    puVar5 = loop;
    iVar1 = uv_fs_lchown(loop,apiStack_750,"test_file_link",0xffffffff,0xffffffff,lchown_cb);
    if (iVar1 != 0) goto LAB_0015586b;
    pcStack_758 = (code *)0x15577d;
    puVar5 = loop;
    uv_run(loop,0);
    ppiVar17 = apiStack_750;
    if (lchown_cb_count != 1) goto LAB_00155870;
    puVar5 = (uv_loop_t *)0x0;
    pcStack_758 = (code *)0x155798;
    iVar1 = uv_fs_close(0,apiStack_750,(ulong)puVar3 & 0xffffffff,0);
    ppiVar17 = apiStack_750;
    if (iVar1 != 0) goto LAB_00155875;
    ppiVar17 = apiStack_750;
    if (puStack_6f8 != (uv_loop_t *)0x0) goto LAB_0015587a;
    pcStack_758 = (code *)0x1557b4;
    uv_fs_req_cleanup(apiStack_750);
    pcStack_758 = (code *)0x1557c2;
    uv_run(loop,0);
    pcStack_758 = (code *)0x1557ce;
    unlink("test_file");
    pcStack_758 = (code *)0x1557da;
    unlink("test_file_link");
    pcStack_758 = (code *)0x1557df;
    puVar10 = (uv_loop_t *)uv_default_loop();
    pcStack_758 = (code *)0x1557f3;
    uv_walk(puVar10,close_walk_cb,0);
    pcStack_758 = (code *)0x1557fd;
    uv_run(puVar10,0);
    pcStack_758 = (code *)0x155802;
    puVar5 = (uv_loop_t *)uv_default_loop();
    pcStack_758 = (code *)0x15580a;
    iVar1 = uv_loop_close();
    ppiVar17 = apiStack_750;
    if (iVar1 == 0) {
      return 0;
    }
  }
  pcStack_758 = chown_cb;
  run_test_fs_chown_cold_21();
  if (puVar5->backend_fd == 0x1a) {
    if (puVar5->watcher_queue[0] == (void *)0x0) {
      chown_cb_count = chown_cb_count + 1;
      iVar1 = uv_fs_req_cleanup();
      return iVar1;
    }
  }
  else {
    puStack_760 = (uv_loop_t *)0x1558a3;
    chown_cb_cold_1();
  }
  puStack_760 = (uv_loop_t *)chown_root_cb;
  chown_cb_cold_2();
  puStack_760 = puVar10;
  if (puVar5->backend_fd == 0x1a) {
    pcStack_768 = (code *)0x1558b7;
    puVar3 = puVar5;
    _Var2 = geteuid();
    pvVar6 = puVar5->watcher_queue[0];
    if (_Var2 != 0) {
      if (pvVar6 == (void *)0xffffffffffffffff) goto LAB_001558cf;
      pcStack_768 = (code *)0x1558ca;
      chown_root_cb_cold_2();
    }
    puVar10 = puVar5;
    if (pvVar6 == (void *)0x0) {
LAB_001558cf:
      chown_cb_count = chown_cb_count + 1;
      iVar1 = uv_fs_req_cleanup(puVar5);
      return iVar1;
    }
  }
  else {
    pcStack_768 = (code *)0x1558e3;
    chown_root_cb_cold_1();
    puVar3 = puVar5;
  }
  pcStack_768 = fchown_cb;
  chown_root_cb_cold_3();
  if (puVar3->backend_fd == 0x1b) {
    if (puVar3->watcher_queue[0] == (void *)0x0) {
      fchown_cb_count = fchown_cb_count + 1;
      iVar1 = uv_fs_req_cleanup();
      return iVar1;
    }
  }
  else {
    pcStack_770 = (code *)0x155907;
    fchown_cb_cold_1();
  }
  pcStack_770 = lchown_cb;
  fchown_cb_cold_2();
  if (puVar3->backend_fd == 0x1e) {
    if (puVar3->watcher_queue[0] == (void *)0x0) {
      lchown_cb_count = lchown_cb_count + 1;
      iVar1 = uv_fs_req_cleanup();
      return iVar1;
    }
  }
  else {
    ppiStack_778 = (int **)0x15592b;
    lchown_cb_cold_1();
  }
  ppiStack_778 = (int **)run_test_fs_link;
  lchown_cb_cold_2();
  pcVar7 = "test_file";
  pcStack_950 = (code *)0x155949;
  puStack_780 = puVar10;
  ppiStack_778 = ppiVar17;
  unlink("test_file");
  pcStack_950 = (code *)0x155955;
  unlink("test_file_link");
  pcStack_950 = (code *)0x155961;
  unlink("test_file_link2");
  pcStack_950 = (code *)0x155966;
  loop = (uv_loop_t *)uv_default_loop();
  pcVar13 = (char *)0x0;
  pcStack_950 = (code *)0x15598a;
  iVar1 = uv_fs_open(0,acStack_938,"test_file",0x42,0x180,0);
  pcVar11 = pcStack_8e0;
  if (iVar1 < 0) {
    pcStack_950 = (code *)0x155cc8;
    run_test_fs_link_cold_1();
LAB_00155cc8:
    pcStack_950 = (code *)0x155ccd;
    run_test_fs_link_cold_2();
LAB_00155ccd:
    pcStack_950 = (code *)0x155cd2;
    run_test_fs_link_cold_3();
LAB_00155cd2:
    pcStack_950 = (code *)0x155cd7;
    run_test_fs_link_cold_4();
LAB_00155cd7:
    pcStack_950 = (code *)0x155cdc;
    run_test_fs_link_cold_5();
LAB_00155cdc:
    pcStack_950 = (code *)0x155ce1;
    run_test_fs_link_cold_6();
LAB_00155ce1:
    pcVar11 = pcVar7;
    pcStack_950 = (code *)0x155ce6;
    run_test_fs_link_cold_7();
LAB_00155ce6:
    pcStack_950 = (code *)0x155ceb;
    run_test_fs_link_cold_8();
LAB_00155ceb:
    pcStack_950 = (code *)0x155cf0;
    run_test_fs_link_cold_9();
LAB_00155cf0:
    pcStack_950 = (code *)0x155cf5;
    run_test_fs_link_cold_10();
LAB_00155cf5:
    pcStack_950 = (code *)0x155cfa;
    run_test_fs_link_cold_11();
LAB_00155cfa:
    pcStack_950 = (code *)0x155cff;
    run_test_fs_link_cold_12();
LAB_00155cff:
    pcStack_950 = (code *)0x155d04;
    run_test_fs_link_cold_13();
LAB_00155d04:
    pcVar7 = pcVar11;
    pcStack_950 = (code *)0x155d09;
    run_test_fs_link_cold_14();
LAB_00155d09:
    pcStack_950 = (code *)0x155d0e;
    run_test_fs_link_cold_15();
LAB_00155d0e:
    pcStack_950 = (code *)0x155d13;
    run_test_fs_link_cold_16();
LAB_00155d13:
    pcStack_950 = (code *)0x155d18;
    run_test_fs_link_cold_17();
LAB_00155d18:
    pcStack_950 = (code *)0x155d1d;
    run_test_fs_link_cold_18();
  }
  else {
    pcVar7 = pcStack_8e0;
    if ((long)pcStack_8e0 < 0) goto LAB_00155cc8;
    pcStack_950 = (code *)0x1559ad;
    uv_fs_req_cleanup(acStack_938);
    pcStack_950 = (code *)0x1559be;
    uVar18 = (uv_buf_t)uv_buf_init(test_buf,0xd);
    uStack_948 = 0;
    pcVar13 = (char *)0x0;
    pcStack_950 = (code *)0x1559f4;
    iov = uVar18;
    iVar1 = uv_fs_write(0,acStack_938,(ulong)pcVar11 & 0xffffffff,&iov,1,0xffffffffffffffff);
    pcVar7 = pcVar11;
    if (iVar1 != 0xd) goto LAB_00155ccd;
    if (pcStack_8e0 != (char *)0xd) goto LAB_00155cd2;
    pcStack_950 = (code *)0x155a16;
    uv_fs_req_cleanup(acStack_938);
    pcStack_950 = (code *)0x155a29;
    uv_fs_close(loop,acStack_938,(ulong)pcVar11 & 0xffffffff,0);
    pcVar13 = (char *)0x0;
    pcStack_950 = (code *)0x155a44;
    iVar1 = uv_fs_link(0,acStack_938,"test_file","test_file_link",0);
    if (iVar1 != 0) goto LAB_00155cd7;
    if (pcStack_8e0 != (char *)0x0) goto LAB_00155cdc;
    pcStack_950 = (code *)0x155a65;
    uv_fs_req_cleanup();
    pcVar13 = (char *)0x0;
    pcStack_950 = (code *)0x155a81;
    iVar1 = uv_fs_open(0,acStack_938,"test_file_link",2,0,0);
    pcVar11 = pcStack_8e0;
    pcVar7 = acStack_938;
    if (iVar1 < 0) goto LAB_00155ce1;
    if ((long)pcStack_8e0 < 0) goto LAB_00155ce6;
    pcStack_950 = (code *)0x155aa4;
    uv_fs_req_cleanup(acStack_938);
    buf[0x10] = '\0';
    buf[0x11] = '\0';
    buf[0x12] = '\0';
    buf[0x13] = '\0';
    buf[0x14] = '\0';
    buf[0x15] = '\0';
    buf[0x16] = '\0';
    buf[0x17] = '\0';
    buf[0x18] = '\0';
    buf[0x19] = '\0';
    buf[0x1a] = '\0';
    buf[0x1b] = '\0';
    buf[0x1c] = '\0';
    buf[0x1d] = '\0';
    buf[0x1e] = '\0';
    buf[0x1f] = '\0';
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    pcStack_950 = (code *)0x155ac6;
    uVar18 = (uv_buf_t)uv_buf_init(buf,0x20);
    uStack_948 = 0;
    pcVar13 = (char *)0x0;
    pcStack_950 = (code *)0x155af8;
    iov = uVar18;
    iVar1 = uv_fs_read(0,acStack_938,(ulong)pcVar11 & 0xffffffff,&iov,1,0);
    if (iVar1 < 0) goto LAB_00155ceb;
    if ((long)pcStack_8e0 < 0) goto LAB_00155cf0;
    pcVar13 = buf;
    pcStack_950 = (code *)0x155b1f;
    iVar1 = strcmp(buf,test_buf);
    if (iVar1 != 0) goto LAB_00155cf5;
    pcStack_950 = (code *)0x155b2e;
    close((int)pcVar11);
    pcStack_950 = (code *)0x155b54;
    pcVar13 = (char *)loop;
    iVar1 = uv_fs_link(loop,acStack_938,"test_file","test_file_link2",link_cb);
    if (iVar1 != 0) goto LAB_00155cfa;
    pcStack_950 = (code *)0x155b6a;
    pcVar13 = (char *)loop;
    uv_run(loop,0);
    if (link_cb_count != 1) goto LAB_00155cff;
    pcVar13 = (char *)0x0;
    pcStack_950 = (code *)0x155b95;
    iVar1 = uv_fs_open(0,acStack_938,"test_file_link2",2,0,0);
    pcVar7 = pcStack_8e0;
    if (iVar1 < 0) goto LAB_00155d04;
    if ((long)pcStack_8e0 < 0) goto LAB_00155d09;
    pcStack_950 = (code *)0x155bb8;
    uv_fs_req_cleanup(acStack_938);
    buf[0x10] = '\0';
    buf[0x11] = '\0';
    buf[0x12] = '\0';
    buf[0x13] = '\0';
    buf[0x14] = '\0';
    buf[0x15] = '\0';
    buf[0x16] = '\0';
    buf[0x17] = '\0';
    buf[0x18] = '\0';
    buf[0x19] = '\0';
    buf[0x1a] = '\0';
    buf[0x1b] = '\0';
    buf[0x1c] = '\0';
    buf[0x1d] = '\0';
    buf[0x1e] = '\0';
    buf[0x1f] = '\0';
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    pcStack_950 = (code *)0x155bda;
    uVar18 = (uv_buf_t)uv_buf_init(buf,0x20);
    uStack_948 = 0;
    pcVar13 = (char *)0x0;
    pcStack_950 = (code *)0x155c0c;
    iov = uVar18;
    iVar1 = uv_fs_read(0,acStack_938,(ulong)pcVar7 & 0xffffffff,&iov,1,0);
    if (iVar1 < 0) goto LAB_00155d0e;
    if ((long)pcStack_8e0 < 0) goto LAB_00155d13;
    pcVar13 = buf;
    pcStack_950 = (code *)0x155c33;
    iVar1 = strcmp(buf,test_buf);
    if (iVar1 != 0) goto LAB_00155d18;
    pcStack_950 = (code *)0x155c50;
    uv_fs_close(loop,acStack_938,(ulong)pcVar7 & 0xffffffff,0);
    pcStack_950 = (code *)0x155c5e;
    uv_run(loop,0);
    pcStack_950 = (code *)0x155c6a;
    unlink("test_file");
    pcStack_950 = (code *)0x155c76;
    unlink("test_file_link");
    pcStack_950 = (code *)0x155c82;
    unlink("test_file_link2");
    pcStack_950 = (code *)0x155c87;
    pcVar7 = (char *)uv_default_loop();
    pcStack_950 = (code *)0x155c9b;
    uv_walk(pcVar7,close_walk_cb,0);
    pcStack_950 = (code *)0x155ca5;
    uv_run(pcVar7,0);
    pcStack_950 = (code *)0x155caa;
    pcVar13 = (char *)uv_default_loop();
    pcStack_950 = (code *)0x155cb2;
    iVar1 = uv_loop_close();
    if (iVar1 == 0) {
      return 0;
    }
  }
  pcStack_950 = link_cb;
  run_test_fs_link_cold_19();
  if (((uv_loop_t *)pcVar13)->backend_fd == 0x17) {
    if (((uv_loop_t *)pcVar13)->watcher_queue[0] == (void *)0x0) {
      link_cb_count = link_cb_count + 1;
      iVar1 = uv_fs_req_cleanup();
      return iVar1;
    }
  }
  else {
    pcStack_958 = (code *)0x155d41;
    link_cb_cold_1();
  }
  pcStack_958 = run_test_fs_readlink;
  link_cb_cold_2();
  pcStack_958 = (code *)pcVar7;
  loop = (uv_loop_t *)uv_default_loop();
  iVar1 = uv_fs_readlink(loop,auStack_b10,"no_such_file",dummy_cb);
  if (iVar1 == 0) {
    iVar1 = uv_run(loop,0);
    if (iVar1 != 0) goto LAB_00155e3b;
    if (dummy_cb_count != 1) goto LAB_00155e40;
    if (lStack_ab0 != 0) goto LAB_00155e45;
    if (lStack_ab8 != -2) goto LAB_00155e4a;
    uv_fs_req_cleanup(auStack_b10);
    iVar1 = uv_fs_readlink(0,auStack_b10,"no_such_file",0);
    if (iVar1 != -2) goto LAB_00155e4f;
    if (lStack_ab0 != 0) goto LAB_00155e54;
    if (lStack_ab8 == -2) {
      uv_fs_req_cleanup(auStack_b10);
      uVar4 = uv_default_loop();
      uv_walk(uVar4,close_walk_cb,0);
      uv_run(uVar4,0);
      uVar4 = uv_default_loop();
      iVar1 = uv_loop_close(uVar4);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_00155e5e;
    }
  }
  else {
    run_test_fs_readlink_cold_1();
LAB_00155e3b:
    run_test_fs_readlink_cold_2();
LAB_00155e40:
    run_test_fs_readlink_cold_3();
LAB_00155e45:
    run_test_fs_readlink_cold_4();
LAB_00155e4a:
    run_test_fs_readlink_cold_5();
LAB_00155e4f:
    run_test_fs_readlink_cold_6();
LAB_00155e54:
    run_test_fs_readlink_cold_7();
  }
  run_test_fs_readlink_cold_8();
LAB_00155e5e:
  run_test_fs_readlink_cold_9();
  dummy_cb_count = dummy_cb_count + 1;
  return extraout_EAX_01;
}

Assistant:

TEST_IMPL(fs_chmod) {
  int r;
  uv_fs_t req;
  uv_file file;

  /* Setup. */
  unlink("test_file");

  loop = uv_default_loop();

  r = uv_fs_open(NULL, &req, "test_file", O_RDWR | O_CREAT,
      S_IWUSR | S_IRUSR, NULL);
  ASSERT(r >= 0);
  ASSERT(req.result >= 0);
  file = req.result;
  uv_fs_req_cleanup(&req);

  iov = uv_buf_init(test_buf, sizeof(test_buf));
  r = uv_fs_write(NULL, &req, file, &iov, 1, -1, NULL);
  ASSERT(r == sizeof(test_buf));
  ASSERT(req.result == sizeof(test_buf));
  uv_fs_req_cleanup(&req);

#ifndef _WIN32
  /* Make the file write-only */
  r = uv_fs_chmod(NULL, &req, "test_file", 0200, NULL);
  ASSERT(r == 0);
  ASSERT(req.result == 0);
  uv_fs_req_cleanup(&req);

  check_permission("test_file", 0200);
#endif

  /* Make the file read-only */
  r = uv_fs_chmod(NULL, &req, "test_file", 0400, NULL);
  ASSERT(r == 0);
  ASSERT(req.result == 0);
  uv_fs_req_cleanup(&req);

  check_permission("test_file", 0400);

  /* Make the file read+write with sync uv_fs_fchmod */
  r = uv_fs_fchmod(NULL, &req, file, 0600, NULL);
  ASSERT(r == 0);
  ASSERT(req.result == 0);
  uv_fs_req_cleanup(&req);

  check_permission("test_file", 0600);

#ifndef _WIN32
  /* async chmod */
  {
    static int mode = 0200;
    req.data = &mode;
  }
  r = uv_fs_chmod(loop, &req, "test_file", 0200, chmod_cb);
  ASSERT(r == 0);
  uv_run(loop, UV_RUN_DEFAULT);
  ASSERT(chmod_cb_count == 1);
  chmod_cb_count = 0; /* reset for the next test */
#endif

  /* async chmod */
  {
    static int mode = 0400;
    req.data = &mode;
  }
  r = uv_fs_chmod(loop, &req, "test_file", 0400, chmod_cb);
  ASSERT(r == 0);
  uv_run(loop, UV_RUN_DEFAULT);
  ASSERT(chmod_cb_count == 1);

  /* async fchmod */
  {
    static int mode = 0600;
    req.data = &mode;
  }
  r = uv_fs_fchmod(loop, &req, file, 0600, fchmod_cb);
  ASSERT(r == 0);
  uv_run(loop, UV_RUN_DEFAULT);
  ASSERT(fchmod_cb_count == 1);

  uv_fs_close(loop, &req, file, NULL);

  /*
   * Run the loop just to check we don't have make any extraneous uv_ref()
   * calls. This should drop out immediately.
   */
  uv_run(loop, UV_RUN_DEFAULT);

  /* Cleanup. */
  unlink("test_file");

  MAKE_VALGRIND_HAPPY();
  return 0;
}